

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

int run_test_tcp_close_reset_accepted_after_socket_shutdown(void)

{
  uv_loop_t *puVar1;
  int iVar2;
  int iVar3;
  undefined8 *extraout_RDX;
  uv_tcp_t *in_RSI;
  long *plVar4;
  int64_t eval_b;
  int64_t eval_a;
  long local_18;
  long local_10;
  
  iVar3 = (int)&local_18;
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,in_RSI);
  client_close = 0;
  shutdown_before_close = 2;
  do_connect(loop,in_RSI);
  local_10 = (long)write_cb_called;
  local_18 = 0;
  if (local_10 == 0) {
    local_10 = (long)close_cb_called;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001c9583;
    local_10 = (long)shutdown_cb_called;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001c9590;
    iVar2 = uv_run(loop,0);
    puVar1 = loop;
    local_10 = (long)iVar2;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001c959d;
    local_10 = 4;
    local_18 = (long)write_cb_called;
    if (local_18 != 4) goto LAB_001c95aa;
    local_10 = 1;
    local_18 = (long)close_cb_called;
    if (local_18 != 1) goto LAB_001c95b7;
    local_10 = (long)shutdown_cb_called;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001c95c4;
    uv_walk(loop,close_walk_cb,0);
    uv_run(puVar1,0);
    local_10 = 0;
    iVar2 = uv_loop_close(loop);
    local_18 = (long)iVar2;
    if (local_10 == local_18) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_1();
LAB_001c9583:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_2();
LAB_001c9590:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_3();
LAB_001c959d:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_4();
LAB_001c95aa:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_5();
LAB_001c95b7:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_6();
LAB_001c95c4:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_7();
  }
  plVar4 = &local_10;
  run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_8();
  if (iVar3 == 0) {
    iVar3 = uv_tcp_init(loop,&tcp_accepted);
    if (iVar3 == 0) {
      iVar3 = uv_accept(plVar4,&tcp_accepted);
      if (iVar3 == 0) {
        iVar3 = uv_read_start(&tcp_accepted,alloc_cb,read_cb);
        return iVar3;
      }
      goto LAB_001c9690;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_001c9690:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x37e460;
}

Assistant:

TEST_IMPL(tcp_close_reset_accepted_after_socket_shutdown) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 0;
  shutdown_before_close = 2;

  do_connect(loop, &tcp_client);

  ASSERT_OK(write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(4, write_cb_called);
  ASSERT_EQ(1, close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}